

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE
qpdf_write_json(qpdf_data qpdf,int version,qpdf_write_fn_t fn,void *udata,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               char *file_prefix,char **wanted_objects)

{
  char *__s;
  QPDF_ERROR_CODE QVar1;
  qpdf_data qpdf_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  anon_class_48_6_c4200ea1 local_120;
  function<void_(_qpdf_data_*)> local_f0;
  _Base_ptr local_d0;
  undefined1 local_c8;
  allocator<char> local_a9;
  value_type local_a8;
  char **local_88;
  char **i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wanted_objects_set;
  undefined1 local_48 [8];
  shared_ptr<Pl_Function> p;
  QPDF_ERROR_CODE status;
  qpdf_json_stream_data_e json_stream_data_local;
  qpdf_stream_decode_level_e decode_level_local;
  void *udata_local;
  qpdf_write_fn_t fn_local;
  qpdf_data p_Stack_10;
  int version_local;
  qpdf_data qpdf_local;
  
  p.super___shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  udata_local = fn;
  fn_local._4_4_ = version;
  p_Stack_10 = qpdf;
  std::
  make_shared<Pl_Function,char_const(&)[11],decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
            ((char (*) [11])local_48,(void **)"write_json",
             (_func_int_char_ptr_unsigned_long_void_ptr **)
             &wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_node_count,&udata_local);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&i);
  if (wanted_objects != (char **)0x0) {
    for (local_88 = wanted_objects; *local_88 != (char *)0x0; local_88 = local_88 + 1) {
      __s = *local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i,&local_a8);
      local_d0 = (_Base_ptr)pVar2.first._M_node;
      local_c8 = pVar2.second;
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  qpdf_00 = p_Stack_10;
  local_120.version = fn_local._4_4_;
  std::shared_ptr<Pl_Function>::shared_ptr(&local_120.p,(shared_ptr<Pl_Function> *)local_48);
  local_120.file_prefix = file_prefix;
  local_120.wanted_objects_set =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&i;
  local_120.decode_level = decode_level;
  local_120.json_stream_data = json_stream_data;
  std::function<void(_qpdf_data*)>::function<qpdf_write_json::__0,void>
            ((function<void(_qpdf_data*)> *)&local_f0,&local_120);
  p.super___shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       trap_errors(qpdf_00,&local_f0);
  std::function<void_(_qpdf_data_*)>::~function(&local_f0);
  qpdf_write_json::$_0::~__0((__0 *)&local_120);
  QVar1 = p.super___shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&i);
  std::shared_ptr<Pl_Function>::~shared_ptr((shared_ptr<Pl_Function> *)local_48);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_write_json(
    qpdf_data qpdf,
    int version,
    qpdf_write_fn_t fn,
    void* udata,
    enum qpdf_stream_decode_level_e decode_level,
    enum qpdf_json_stream_data_e json_stream_data,
    char const* file_prefix,
    char const* const* wanted_objects)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    auto p = std::make_shared<Pl_Function>("write_json", nullptr, fn, udata);
    std::set<std::string> wanted_objects_set;
    if (wanted_objects) {
        for (auto i = wanted_objects; *i; ++i) {
            wanted_objects_set.insert(*i);
        }
    }
    status = trap_errors(
        qpdf,
        [version, p, decode_level, json_stream_data, file_prefix, &wanted_objects_set](
            qpdf_data q) {
            q->qpdf->writeJSON(
                version, p.get(), decode_level, json_stream_data, file_prefix, wanted_objects_set);
        });
    return status;
}